

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O3

void google::protobuf::FileDescriptorProto::MergeImpl(MessageLite *to_msg,MessageLite *from_msg)

{
  ulong uVar1;
  MessageLite *to_msg_00;
  _func_int **pp_Var2;
  void *pvVar3;
  Arena *extraout_RDX;
  Arena *pAVar4;
  uint unaff_EBP;
  string *value;
  MessageLite *pMVar5;
  Arena *arena;
  
  arena = (Arena *)(to_msg->_internal_metadata_).ptr_;
  if (((ulong)arena & 1) != 0) {
    arena = *(Arena **)((ulong)arena & 0xfffffffffffffffe);
  }
  if (from_msg == to_msg) {
    value = (string *)to_msg;
    pMVar5 = from_msg;
    MergeImpl();
    pAVar4 = extraout_RDX;
LAB_00253c6a:
    pAVar4 = *(Arena **)((ulong)pAVar4 & 0xfffffffffffffffe);
LAB_00253b34:
    internal::ArenaStringPtr::Set<>((ArenaStringPtr *)pMVar5,value,pAVar4);
  }
  else {
    if (*(int *)&from_msg[2]._vptr_MessageLite != 0) {
      internal::RepeatedPtrFieldBase::MergeFrom<std::__cxx11::string>
                ((RepeatedPtrFieldBase *)&to_msg[1]._internal_metadata_,
                 (RepeatedPtrFieldBase *)&from_msg[1]._internal_metadata_);
    }
    if ((int)from_msg[3]._internal_metadata_.ptr_ != 0) {
      internal::RepeatedPtrFieldBase::MergeFromConcreteMessage
                ((RepeatedPtrFieldBase *)(to_msg + 3),(RepeatedPtrFieldBase *)(from_msg + 3),
                 Arena::CopyConstruct<google::protobuf::DescriptorProto>);
    }
    if (*(int *)&from_msg[5]._vptr_MessageLite != 0) {
      internal::RepeatedPtrFieldBase::MergeFromConcreteMessage
                ((RepeatedPtrFieldBase *)&to_msg[4]._internal_metadata_,
                 (RepeatedPtrFieldBase *)&from_msg[4]._internal_metadata_,
                 Arena::CopyConstruct<google::protobuf::EnumDescriptorProto>);
    }
    if ((int)from_msg[6]._internal_metadata_.ptr_ != 0) {
      internal::RepeatedPtrFieldBase::MergeFromConcreteMessage
                ((RepeatedPtrFieldBase *)(to_msg + 6),(RepeatedPtrFieldBase *)(from_msg + 6),
                 Arena::CopyConstruct<google::protobuf::ServiceDescriptorProto>);
    }
    if (*(int *)&from_msg[8]._vptr_MessageLite != 0) {
      internal::RepeatedPtrFieldBase::MergeFromConcreteMessage
                ((RepeatedPtrFieldBase *)&to_msg[7]._internal_metadata_,
                 (RepeatedPtrFieldBase *)&from_msg[7]._internal_metadata_,
                 Arena::CopyConstruct<google::protobuf::FieldDescriptorProto>);
    }
    RepeatedField<int>::MergeFrom
              ((RepeatedField<int> *)(to_msg + 9),(RepeatedField<int> *)(from_msg + 9));
    RepeatedField<int>::MergeFrom
              ((RepeatedField<int> *)(to_msg + 10),(RepeatedField<int> *)(from_msg + 10));
    if ((int)from_msg[0xb]._internal_metadata_.ptr_ != 0) {
      internal::RepeatedPtrFieldBase::MergeFrom<std::__cxx11::string>
                ((RepeatedPtrFieldBase *)(to_msg + 0xb),(RepeatedPtrFieldBase *)(from_msg + 0xb));
    }
    unaff_EBP = *(uint *)&from_msg[1]._vptr_MessageLite;
    if ((unaff_EBP & 0x3f) == 0) goto LAB_00253c18;
    if ((unaff_EBP & 1) != 0) {
      uVar1 = from_msg[0xc]._internal_metadata_.ptr_;
      *(uint *)&to_msg[1]._vptr_MessageLite = *(uint *)&to_msg[1]._vptr_MessageLite | 1;
      value = (string *)(uVar1 & 0xfffffffffffffffc);
      pMVar5 = (MessageLite *)&to_msg[0xc]._internal_metadata_;
      pAVar4 = (Arena *)(to_msg->_internal_metadata_).ptr_;
      if (((ulong)pAVar4 & 1) != 0) goto LAB_00253c6a;
      goto LAB_00253b34;
    }
  }
  if ((unaff_EBP & 2) != 0) {
    pp_Var2 = from_msg[0xd]._vptr_MessageLite;
    *(uint *)&to_msg[1]._vptr_MessageLite = *(uint *)&to_msg[1]._vptr_MessageLite | 2;
    pAVar4 = (Arena *)(to_msg->_internal_metadata_).ptr_;
    if (((ulong)pAVar4 & 1) != 0) {
      pAVar4 = *(Arena **)((ulong)pAVar4 & 0xfffffffffffffffe);
    }
    internal::ArenaStringPtr::Set<>
              ((ArenaStringPtr *)(to_msg + 0xd),(string *)((ulong)pp_Var2 & 0xfffffffffffffffc),
               pAVar4);
  }
  if ((unaff_EBP & 4) != 0) {
    uVar1 = from_msg[0xd]._internal_metadata_.ptr_;
    *(uint *)&to_msg[1]._vptr_MessageLite = *(uint *)&to_msg[1]._vptr_MessageLite | 4;
    pAVar4 = (Arena *)(to_msg->_internal_metadata_).ptr_;
    if (((ulong)pAVar4 & 1) != 0) {
      pAVar4 = *(Arena **)((ulong)pAVar4 & 0xfffffffffffffffe);
    }
    internal::ArenaStringPtr::Set<>
              ((ArenaStringPtr *)&to_msg[0xd]._internal_metadata_,
               (string *)(uVar1 & 0xfffffffffffffffc),pAVar4);
  }
  if ((unaff_EBP & 8) != 0) {
    pMVar5 = (MessageLite *)from_msg[0xe]._vptr_MessageLite;
    if (pMVar5 == (MessageLite *)0x0) {
      MergeImpl((FileDescriptorProto *)&stack0xffffffffffffffd0);
      goto LAB_00253c98;
    }
    if ((MessageLite *)to_msg[0xe]._vptr_MessageLite == (MessageLite *)0x0) {
      pp_Var2 = (_func_int **)Arena::CopyConstruct<google::protobuf::FileOptions>(arena,pMVar5);
      to_msg[0xe]._vptr_MessageLite = pp_Var2;
    }
    else {
      FileOptions::MergeImpl((MessageLite *)to_msg[0xe]._vptr_MessageLite,pMVar5);
    }
  }
  if ((unaff_EBP & 0x10) != 0) {
    pMVar5 = (MessageLite *)from_msg[0xe]._internal_metadata_.ptr_;
    if (pMVar5 == (MessageLite *)0x0) {
LAB_00253c98:
      MergeImpl((FileDescriptorProto *)&stack0xffffffffffffffd0);
    }
    to_msg_00 = (MessageLite *)to_msg[0xe]._internal_metadata_.ptr_;
    if (to_msg_00 == (MessageLite *)0x0) {
      pvVar3 = Arena::CopyConstruct<google::protobuf::SourceCodeInfo>(arena,pMVar5);
      to_msg[0xe]._internal_metadata_.ptr_ = (intptr_t)pvVar3;
    }
    else {
      SourceCodeInfo::MergeImpl(to_msg_00,pMVar5);
    }
  }
  if ((unaff_EBP & 0x20) != 0) {
    *(undefined4 *)&to_msg[0xf]._vptr_MessageLite = *(undefined4 *)&from_msg[0xf]._vptr_MessageLite;
  }
LAB_00253c18:
  *(uint *)&to_msg[1]._vptr_MessageLite = *(uint *)&to_msg[1]._vptr_MessageLite | unaff_EBP;
  uVar1 = (from_msg->_internal_metadata_).ptr_;
  if ((uVar1 & 1) == 0) {
    return;
  }
  internal::InternalMetadata::DoMergeFrom<google::protobuf::UnknownFieldSet>
            (&to_msg->_internal_metadata_,(UnknownFieldSet *)((uVar1 & 0xfffffffffffffffe) + 8));
  return;
}

Assistant:

void FileDescriptorProto::MergeImpl(::google::protobuf::MessageLite& to_msg, const ::google::protobuf::MessageLite& from_msg) {
  auto* const _this = static_cast<FileDescriptorProto*>(&to_msg);
  auto& from = static_cast<const FileDescriptorProto&>(from_msg);
  ::google::protobuf::Arena* arena = _this->GetArena();
  // @@protoc_insertion_point(class_specific_merge_from_start:google.protobuf.FileDescriptorProto)
  ABSL_DCHECK_NE(&from, _this);
  ::uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  _this->_internal_mutable_dependency()->MergeFrom(from._internal_dependency());
  _this->_internal_mutable_message_type()->MergeFrom(
      from._internal_message_type());
  _this->_internal_mutable_enum_type()->MergeFrom(
      from._internal_enum_type());
  _this->_internal_mutable_service()->MergeFrom(
      from._internal_service());
  _this->_internal_mutable_extension()->MergeFrom(
      from._internal_extension());
  _this->_internal_mutable_public_dependency()->MergeFrom(from._internal_public_dependency());
  _this->_internal_mutable_weak_dependency()->MergeFrom(from._internal_weak_dependency());
  _this->_internal_mutable_option_dependency()->MergeFrom(from._internal_option_dependency());
  cached_has_bits = from._impl_._has_bits_[0];
  if ((cached_has_bits & 0x0000003fu) != 0) {
    if ((cached_has_bits & 0x00000001u) != 0) {
      _this->_internal_set_name(from._internal_name());
    }
    if ((cached_has_bits & 0x00000002u) != 0) {
      _this->_internal_set_package(from._internal_package());
    }
    if ((cached_has_bits & 0x00000004u) != 0) {
      _this->_internal_set_syntax(from._internal_syntax());
    }
    if ((cached_has_bits & 0x00000008u) != 0) {
      ABSL_DCHECK(from._impl_.options_ != nullptr);
      if (_this->_impl_.options_ == nullptr) {
        _this->_impl_.options_ = ::google::protobuf::Message::CopyConstruct(arena, *from._impl_.options_);
      } else {
        _this->_impl_.options_->MergeFrom(*from._impl_.options_);
      }
    }
    if ((cached_has_bits & 0x00000010u) != 0) {
      ABSL_DCHECK(from._impl_.source_code_info_ != nullptr);
      if (_this->_impl_.source_code_info_ == nullptr) {
        _this->_impl_.source_code_info_ = ::google::protobuf::Message::CopyConstruct(arena, *from._impl_.source_code_info_);
      } else {
        _this->_impl_.source_code_info_->MergeFrom(*from._impl_.source_code_info_);
      }
    }
    if ((cached_has_bits & 0x00000020u) != 0) {
      _this->_impl_.edition_ = from._impl_.edition_;
    }
  }
  _this->_impl_._has_bits_[0] |= cached_has_bits;
  _this->_internal_metadata_.MergeFrom<::google::protobuf::UnknownFieldSet>(from._internal_metadata_);
}